

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazyExtensionRangeEmitter::AddToRange(google::protobuf::Descriptor::
ExtensionRange_const__(void *this,ExtensionRange *range)

{
  int iVar1;
  int *piVar2;
  int local_20;
  int local_1c;
  ExtensionRange *local_18;
  ExtensionRange *range_local;
  LazyExtensionRangeEmitter *this_local;
  
  local_18 = range;
  range_local = (ExtensionRange *)this;
  if ((*(byte *)((long)this + 0x10) & 1) == 0) {
    iVar1 = protobuf::Descriptor::ExtensionRange::start_number(range);
    *(int *)((long)this + 0x14) = iVar1;
    iVar1 = protobuf::Descriptor::ExtensionRange::end_number(local_18);
    *(int *)((long)this + 0x18) = iVar1;
    *(undefined1 *)((long)this + 0x10) = 1;
  }
  else {
    local_1c = protobuf::Descriptor::ExtensionRange::start_number(range);
    piVar2 = std::min<int>((int *)((long)this + 0x14),&local_1c);
    *(int *)((long)this + 0x14) = *piVar2;
    local_20 = protobuf::Descriptor::ExtensionRange::end_number(local_18);
    piVar2 = std::max<int>((int *)((long)this + 0x18),&local_20);
    *(int *)((long)this + 0x18) = *piVar2;
  }
  return;
}

Assistant:

void AddToRange(const Descriptor::ExtensionRange* range) {
      if (!has_current_range_) {
        min_start_ = range->start_number();
        max_end_ = range->end_number();
        has_current_range_ = true;
      } else {
        min_start_ = std::min(min_start_, range->start_number());
        max_end_ = std::max(max_end_, range->end_number());
      }
    }